

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLowerGraph.cpp
# Opt level: O2

void PrintGraph(InstructionRegVmLowerGraphContext *ctx,RegVmLoweredModule *lowModule)

{
  RegVmLoweredFunction **ppRVar1;
  uint i;
  uint index;
  
  ctx->code = lowModule->vmModule->code;
  for (index = 0; index < (lowModule->functions).count; index = index + 1) {
    ppRVar1 = SmallArray<RegVmLoweredFunction_*,_32U>::operator[](&lowModule->functions,index);
    PrintFunction(ctx,lowModule,*ppRVar1);
  }
  OutputContext::Flush(ctx->output);
  return;
}

Assistant:

void PrintGraph(InstructionRegVmLowerGraphContext &ctx, RegVmLoweredModule *lowModule)
{
	ctx.code = lowModule->vmModule->code;

	for(unsigned i = 0; i < lowModule->functions.size(); i++)
		PrintFunction(ctx, lowModule, lowModule->functions[i]);

	ctx.output.Flush();
}